

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.cpp
# Opt level: O0

string * __thiscall
Test::Formats::internal::utf32_to_string_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char32_t *ptr,size_t length)

{
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  uint32_t local_5c;
  ulong uStack_58;
  uint32_t code;
  size_t i;
  undefined1 local_40 [8];
  string result;
  size_t length_local;
  char32_t *ptr_local;
  
  result.field_2._8_8_ = ptr;
  if (NATIVE_UTF8) {
    std::__cxx11::string::string((string *)local_40);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               result.field_2._8_8_);
    for (uStack_58 = 0; uStack_58 < (ulong)result.field_2._8_8_; uStack_58 = uStack_58 + 1) {
      local_5c = *(uint32_t *)(this + uStack_58 * 4);
      appendAsUtf8(local_5c,(string *)local_40);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::shrink_to_fit
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::operator+(&local_80,"\'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    std::operator+(__return_storage_ptr__,&local_80,"\'");
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"(unknown encoding)",&local_81);
    std::allocator<char>::~allocator(&local_81);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Formats::internal::utf32_to_string(const char32_t *ptr, std::size_t length) {
  if (NATIVE_UTF8) {
    // Convert UTF-32 to UTF-8
    std::string result{};
    result.reserve(length);

    for (std::size_t i = 0; i < length; ++i) {
      auto code = static_cast<uint32_t>(ptr[i]);
      appendAsUtf8(code, result);
    }

    result.shrink_to_fit();
    return "'" + result + "'";
  }
#ifdef _MSC_VER
  std::mbstate_t state{};
  std::string result;
  for (std::size_t i = 0; i < length; ++i) {
    std::array<char, MB_LEN_MAX> tmp{};
    std::size_t rc = std::c32rtomb(tmp.data(), ptr[i], &state);
    if (rc == static_cast<std::size_t>(-1)) {
      result.push_back('?');
      state = std::mbstate_t{};
      rc = 0;
    }
    for (std::size_t i = 0; i < rc; ++i) {
      result.push_back(tmp[i]);
    }
  }
  return "'" + result + "'";
#else
  return "(unknown encoding)";
#endif
}